

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMapFileReaderTests.cpp
# Opt level: O2

int testMMapFileReaderTestsFileErrorEmpty(void)

{
  string *filename;
  ostream *poVar1;
  AutoDeleteTempFile tempfile;
  MMapFileReader local_60;
  
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(&tempfile);
  filename = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_(&tempfile);
  MILBlob::Blob::MMapFileReader::MMapFileReader(&local_60,filename);
  MILBlob::Blob::MMapFileReader::~MMapFileReader(&local_60);
  poVar1 = std::operator<<((ostream *)&std::clog,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/MMapFileReaderTests.cpp"
                          );
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x20);
  std::operator<<(poVar1,": expected exception, but none thrown.\n");
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile(&tempfile);
  return 1;
}

Assistant:

int testMMapFileReaderTestsFileErrorEmpty()
{
    AutoDeleteTempFile tempfile;
    ML_ASSERT_THROWS_WITH_MESSAGE(MMapFileReader(tempfile.GetFilename()), std::runtime_error, "Unable to mmap");

    return 0;
}